

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<double>::MultAdd
          (TPZSkylMatrix<double> *this,TPZFMatrix<double> *x,TPZFMatrix<double> *y,
          TPZFMatrix<double> *z,double alpha,double beta,int opt)

{
  double **ppdVar1;
  double *pdVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  int64_t iVar10;
  long lVar11;
  int r;
  long row;
  long lVar12;
  long lVar13;
  double extraout_XMM0_Qa;
  double dVar14;
  long local_68;
  
  if (opt == 0) {
    iVar10 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (iVar10 == (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) goto LAB_00d4b039;
LAB_00d4b03f:
    TPZMatrix<double>::Error
              ("virtual void TPZSkylMatrix<double>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = double]"
               ," <matrixs with incompatible dimensions>");
    iVar10 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  }
  else {
    iVar10 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
LAB_00d4b039:
    if ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow != iVar10) goto LAB_00d4b03f;
  }
  if ((z->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow == iVar10) {
    lVar3 = (z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    lVar5 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    lVar6 = lVar3;
    if (lVar3 == lVar5) goto LAB_00d4b092;
  }
  else {
    lVar5 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  }
  (*(z->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (z,iVar10,lVar5);
  lVar3 = (z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  lVar6 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
LAB_00d4b092:
  if ((((lVar6 != (y->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol) || (lVar6 != lVar3)) ||
      (lVar5 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
      lVar5 != (y->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow)) ||
     (lVar5 != (z->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow)) {
    poVar4 = std::operator<<((ostream *)&std::cout,"x.Cols = ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," y.Cols()");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," z.Cols() ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," x.Rows() ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," y.Rows() ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," z.Rows() ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    TPZMatrix<double>::Error
              ("virtual void TPZSkylMatrix<double>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = double]"
               ," incompatible dimensions\n");
  }
  TPZMatrix<double>::PrepareZ(&this->super_TPZMatrix<double>,y,z,beta,opt);
  lVar5 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar3 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (lVar5 < 1) {
    lVar5 = 0;
  }
  local_68 = 0;
  if (lVar3 < 1) {
    lVar3 = 0;
  }
  for (lVar6 = 0; lVar6 != lVar3; lVar6 = lVar6 + 1) {
    lVar13 = 8;
    for (row = 0; row != lVar5; row = row + 1) {
      ppdVar1 = (this->fElem).fStore;
      pdVar2 = ppdVar1[row];
      pdVar7 = ppdVar1[row + 1];
      lVar12 = (long)pdVar7 - (long)pdVar2;
      lVar9 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * local_68 + lVar13;
      dVar14 = 0.0;
      lVar11 = 0;
      pdVar8 = pdVar7;
      while (pdVar8 = pdVar8 + -1, pdVar2 < pdVar8) {
        dVar14 = dVar14 + *pdVar8 * *(double *)((long)x->fElem + lVar11 + (lVar9 - lVar12));
        lVar11 = lVar11 + 8;
      }
      if ((long)pdVar2 + (lVar11 - (long)pdVar7) == -8) {
        dVar14 = dVar14 + *pdVar2 * *(double *)
                                     ((long)x->fElem + lVar11 + lVar9 + (lVar12 >> 3) * -8);
      }
      pdVar7 = TPZFMatrix<double>::operator()(z,row,lVar6);
      *pdVar7 = dVar14 * alpha + *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()(z,(row - (lVar12 >> 3)) + 1,lVar6);
      (*(x->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
                (x,row,lVar6);
      pdVar8 = (double *)((long)(this->fElem).fStore[row] + lVar12);
      while (pdVar8 = pdVar8 + -1, pdVar2 < pdVar8) {
        *pdVar7 = *pdVar8 * alpha * extraout_XMM0_Qa + *pdVar7;
        pdVar7 = pdVar7 + 1;
      }
      lVar13 = lVar13 + 8;
    }
    local_68 = local_68 + 8;
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                  const TVar alpha,const TVar beta ,const int opt) const {
	// Computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot overlap in memory
	
	if (this->fDecomposed != ENoDecompose) {
        //		DebugStop();
	}
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," <matrixs with incompatible dimensions>" );
	if(z.Rows() != x.Rows() || z.Cols() != x.Cols()) z.Redim(x.Rows(),x.Cols());
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		cout << "x.Cols = " << x.Cols() << " y.Cols()"<< y.Cols() << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows() << " y.Rows() "<< y.Rows() << " z.Rows() "<< z.Rows() << endl;
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);

	const int64_t rows = this->Rows();
	const int64_t xcols = x.Cols();
	for (auto ic = 0; ic < xcols; ic++) {
		for(auto r = 0 ; r < rows ; r++ ) {
			const int64_t offset = Size(r);
			TVar val = 0.;
			const TVar *p = &x.g((r-offset+1),ic);
			TVar *diag = fElem[r] + offset-1;
			const TVar *diaglast = fElem[r];
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) val += *diag-- * *p;
                    else val += std::conj(*diag--) * *p;
                }else{
                    val += *diag-- * *p;
                }
				p ++;
			}
			if( diag == diaglast ) val += *diag * *p;
			z(r,ic) += val*alpha;
			TVar *zp = &z((r-offset+1),ic);
			val = x.GetVal(r,ic);
			diag = fElem[r] + offset-1;
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) *zp += alpha * std::conj(*diag--) * val;
                    else *zp += alpha * *diag-- * val;
                }else{
                    *zp += alpha * *diag-- * val;
                }
                zp ++;
			}
		}
	}
}